

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamProgram.h
# Opt level: O0

void __thiscall BamTools::SamProgram::~SamProgram(SamProgram *this)

{
  string *in_RDI;
  vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_> *unaff_retaddr;
  
  std::__cxx11::string::~string(in_RDI + 0xb8);
  std::vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>::~vector
            (unaff_retaddr);
  std::__cxx11::string::~string(in_RDI + 0x80);
  std::__cxx11::string::~string(in_RDI + 0x60);
  std::__cxx11::string::~string(in_RDI + 0x40);
  std::__cxx11::string::~string(in_RDI + 0x20);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

struct API_EXPORT SamProgram
{

    // ctor & dtor
    SamProgram();
    SamProgram(const std::string& id);

    // query/modify entire program record
    void Clear();  // clears all data fields

    // convenience query methods
    bool HasCommandLine() const;  // returns true if program record has a command line entry
    bool HasID() const;           // returns true if program record has an ID
    bool HasName() const;         // returns true if program record has a name
    bool HasPreviousProgramID()
        const;                // returns true if program record has a 'previous program ID'
    bool HasVersion() const;  // returns true if program record has a version

    // data members
    std::string CommandLine;                  // CL:<CommandLine>
    std::string ID;                           // ID:<ID>          *Required for valid SAM header*
    std::string Name;                         // PN:<Name>
    std::string PreviousProgramID;            // PP:<PreviousProgramID>
    std::string Version;                      // VN:<Version>
    std::vector<CustomHeaderTag> CustomTags;  // optional custom tags

    // internal (non-standard) methods & fields
private:
    bool HasNextProgramID() const;
    std::string NextProgramID;
    friend class BamTools::SamProgramChain;
}